

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void bilinear_filter(uint8_t *src,int src_stride,int xoffset,int yoffset,uint8_t *dst,int w,int h)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint8_t *b;
  uint8_t *puVar6;
  undefined1 auVar7 [16];
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint8_t uVar23;
  short sVar24;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar33;
  short sVar34;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  undefined1 auVar35 [16];
  undefined1 auVar44 [16];
  undefined1 auVar52 [16];
  short sVar59;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar45 [16];
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  undefined1 auVar39 [16];
  undefined1 auVar47 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar41 [16];
  undefined1 auVar49 [16];
  undefined1 auVar42 [16];
  undefined1 auVar50 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  
  lVar5 = (long)w;
  if (xoffset == 0) {
    puVar6 = dst;
    for (iVar4 = 0; iVar4 <= h; iVar4 = iVar4 + 1) {
      for (lVar3 = 0; lVar3 < lVar5; lVar3 = lVar3 + 0x10) {
        uVar2 = *(undefined8 *)(src + lVar3 + 8);
        *(undefined8 *)(puVar6 + lVar3) = *(undefined8 *)(src + lVar3);
        *(undefined8 *)(puVar6 + lVar3 + 8) = uVar2;
      }
      src = src + src_stride;
      puVar6 = puVar6 + (uint)w;
    }
  }
  else if (xoffset == 4) {
    puVar6 = dst;
    for (iVar4 = 0; iVar4 <= h; iVar4 = iVar4 + 1) {
      for (lVar3 = 0; lVar3 < lVar5; lVar3 = lVar3 + 0x10) {
        puVar1 = src + lVar3;
        uVar8 = pavgb(puVar1[1],*puVar1);
        uVar9 = pavgb(puVar1[2],puVar1[1]);
        uVar10 = pavgb(puVar1[3],puVar1[2]);
        uVar11 = pavgb(puVar1[4],puVar1[3]);
        uVar12 = pavgb(puVar1[5],puVar1[4]);
        uVar13 = pavgb(puVar1[6],puVar1[5]);
        uVar14 = pavgb(puVar1[7],puVar1[6]);
        uVar15 = pavgb(puVar1[8],puVar1[7]);
        uVar16 = pavgb(puVar1[9],puVar1[8]);
        uVar17 = pavgb(puVar1[10],puVar1[9]);
        uVar18 = pavgb(puVar1[0xb],puVar1[10]);
        uVar19 = pavgb(puVar1[0xc],puVar1[0xb]);
        uVar20 = pavgb(puVar1[0xd],puVar1[0xc]);
        uVar21 = pavgb(puVar1[0xe],puVar1[0xd]);
        uVar22 = pavgb(puVar1[0xf],puVar1[0xe]);
        uVar23 = pavgb(src[lVar3 + 0x10],puVar1[0xf]);
        puVar1 = puVar6 + lVar3;
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        puVar1[2] = uVar10;
        puVar1[3] = uVar11;
        puVar1[4] = uVar12;
        puVar1[5] = uVar13;
        puVar1[6] = uVar14;
        puVar1[7] = uVar15;
        puVar1[8] = uVar16;
        puVar1[9] = uVar17;
        puVar1[10] = uVar18;
        puVar1[0xb] = uVar19;
        puVar1[0xc] = uVar20;
        puVar1[0xd] = uVar21;
        puVar1[0xe] = uVar22;
        puVar1[0xf] = uVar23;
      }
      src = src + src_stride;
      puVar6 = puVar6 + (uint)w;
    }
  }
  else {
    auVar7 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[xoffset]),
                     ZEXT216((ushort)bilinear_filters_2t[xoffset]),0);
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = auVar7._0_4_;
    auVar7._12_4_ = auVar7._0_4_;
    puVar6 = dst;
    for (iVar4 = 0; iVar4 <= h; iVar4 = iVar4 + 1) {
      for (lVar3 = 0; lVar3 < lVar5; lVar3 = lVar3 + 0x10) {
        auVar25 = *(undefined1 (*) [16])(src + lVar3);
        auVar43._0_14_ = auVar25._0_14_;
        auVar43[0xe] = auVar25[7];
        auVar43[0xf] = auVar25[8];
        auVar42._14_2_ = auVar43._14_2_;
        auVar42._0_13_ = auVar25._0_13_;
        auVar42[0xd] = auVar25[7];
        auVar41._13_3_ = auVar42._13_3_;
        auVar41._0_12_ = auVar25._0_12_;
        auVar41[0xc] = auVar25[6];
        auVar40._12_4_ = auVar41._12_4_;
        auVar40._0_11_ = auVar25._0_11_;
        auVar40[0xb] = auVar25[6];
        auVar39._11_5_ = auVar40._11_5_;
        auVar39._0_10_ = auVar25._0_10_;
        auVar39[10] = auVar25[5];
        auVar38._10_6_ = auVar39._10_6_;
        auVar38._0_9_ = auVar25._0_9_;
        auVar38[9] = auVar25[5];
        auVar37._9_7_ = auVar38._9_7_;
        auVar37._0_8_ = auVar25._0_8_;
        auVar37[8] = auVar25[4];
        auVar36._8_8_ = auVar37._8_8_;
        auVar36[7] = auVar25[4];
        auVar36[6] = auVar25[3];
        auVar36[5] = auVar25[3];
        auVar36[4] = auVar25[2];
        auVar36[3] = auVar25[2];
        auVar35._0_2_ = auVar25._0_2_;
        auVar36[2] = auVar25[1];
        auVar36._0_2_ = auVar35._0_2_;
        auVar35._2_14_ = auVar36._2_14_;
        auVar52 = pmaddubsw(auVar35,auVar7);
        sVar34 = pavgw(auVar52._0_2_ >> 6,0);
        sVar53 = pavgw(auVar52._2_2_ >> 6,0);
        sVar54 = pavgw(auVar52._4_2_ >> 6,0);
        sVar55 = pavgw(auVar52._6_2_ >> 6,0);
        sVar56 = pavgw(auVar52._8_2_ >> 6,0);
        sVar57 = pavgw(auVar52._10_2_ >> 6,0);
        sVar58 = pavgw(auVar52._12_2_ >> 6,0);
        sVar59 = pavgw(auVar52._14_2_ >> 6,0);
        auVar52._0_2_ = auVar25._8_2_;
        auVar52[2] = auVar25[9];
        auVar52[3] = auVar25[10];
        auVar52[4] = auVar25[10];
        auVar52[5] = auVar25[0xb];
        auVar52[6] = auVar25[0xb];
        auVar52[7] = auVar25[0xc];
        auVar52[8] = auVar25[0xc];
        auVar52[9] = auVar25[0xd];
        auVar52[10] = auVar25[0xd];
        auVar52[0xb] = auVar25[0xe];
        auVar52[0xc] = auVar25[0xe];
        auVar52[0xd] = auVar25[0xf];
        auVar52[0xe] = auVar25[0xf];
        auVar52[0xf] = src[lVar3 + 0x10];
        auVar25 = pmaddubsw(auVar52,auVar7);
        sVar24 = pavgw(auVar25._0_2_ >> 6,0);
        sVar27 = pavgw(auVar25._2_2_ >> 6,0);
        sVar28 = pavgw(auVar25._4_2_ >> 6,0);
        sVar29 = pavgw(auVar25._6_2_ >> 6,0);
        sVar30 = pavgw(auVar25._8_2_ >> 6,0);
        sVar31 = pavgw(auVar25._10_2_ >> 6,0);
        sVar32 = pavgw(auVar25._12_2_ >> 6,0);
        sVar33 = pavgw(auVar25._14_2_ >> 6,0);
        puVar1 = puVar6 + lVar3;
        *puVar1 = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
        puVar1[1] = (0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 - (0xff < sVar53);
        puVar1[2] = (0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54);
        puVar1[3] = (0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55);
        puVar1[4] = (0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56);
        puVar1[5] = (0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57);
        puVar1[6] = (0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58);
        puVar1[7] = (0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59);
        puVar1[8] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
        puVar1[9] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
        puVar1[10] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
        puVar1[0xb] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
        puVar1[0xc] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
        puVar1[0xd] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
        puVar1[0xe] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
        puVar1[0xf] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
      }
      src = src + src_stride;
      puVar6 = puVar6 + (uint)w;
    }
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      iVar4 = 0;
      if (h < 1) {
        h = iVar4;
      }
      for (; iVar4 != h; iVar4 = iVar4 + 1) {
        for (lVar3 = 0; lVar3 < lVar5; lVar3 = lVar3 + 0x10) {
          puVar6 = dst + lVar3;
          puVar1 = dst + lVar3 + lVar5;
          uVar8 = pavgb(*puVar1,*puVar6);
          uVar9 = pavgb(puVar1[1],puVar6[1]);
          uVar10 = pavgb(puVar1[2],puVar6[2]);
          uVar11 = pavgb(puVar1[3],puVar6[3]);
          uVar12 = pavgb(puVar1[4],puVar6[4]);
          uVar13 = pavgb(puVar1[5],puVar6[5]);
          uVar14 = pavgb(puVar1[6],puVar6[6]);
          uVar15 = pavgb(puVar1[7],puVar6[7]);
          uVar16 = pavgb(puVar1[8],puVar6[8]);
          uVar17 = pavgb(puVar1[9],puVar6[9]);
          uVar18 = pavgb(puVar1[10],puVar6[10]);
          uVar19 = pavgb(puVar1[0xb],puVar6[0xb]);
          uVar20 = pavgb(puVar1[0xc],puVar6[0xc]);
          uVar21 = pavgb(puVar1[0xd],puVar6[0xd]);
          uVar22 = pavgb(puVar1[0xe],puVar6[0xe]);
          uVar23 = pavgb(puVar1[0xf],puVar6[0xf]);
          puVar6 = dst + lVar3;
          *puVar6 = uVar8;
          puVar6[1] = uVar9;
          puVar6[2] = uVar10;
          puVar6[3] = uVar11;
          puVar6[4] = uVar12;
          puVar6[5] = uVar13;
          puVar6[6] = uVar14;
          puVar6[7] = uVar15;
          puVar6[8] = uVar16;
          puVar6[9] = uVar17;
          puVar6[10] = uVar18;
          puVar6[0xb] = uVar19;
          puVar6[0xc] = uVar20;
          puVar6[0xd] = uVar21;
          puVar6[0xe] = uVar22;
          puVar6[0xf] = uVar23;
        }
        dst = dst + (uint)w;
      }
    }
    else {
      auVar7 = pshuflw(ZEXT216((ushort)bilinear_filters_2t[yoffset]),
                       ZEXT216((ushort)bilinear_filters_2t[yoffset]),0);
      auVar25._0_4_ = auVar7._0_4_;
      auVar25._4_4_ = auVar25._0_4_;
      auVar25._8_4_ = auVar25._0_4_;
      auVar25._12_4_ = auVar25._0_4_;
      iVar4 = 0;
      if (h < 1) {
        h = iVar4;
      }
      for (; iVar4 != h; iVar4 = iVar4 + 1) {
        for (lVar3 = 0; lVar3 < lVar5; lVar3 = lVar3 + 0x10) {
          auVar7 = *(undefined1 (*) [16])(dst + lVar3);
          puVar6 = dst + lVar3 + lVar5;
          auVar51._0_14_ = auVar7._0_14_;
          auVar51[0xe] = auVar7[7];
          auVar51[0xf] = puVar6[7];
          auVar50._14_2_ = auVar51._14_2_;
          auVar50._0_13_ = auVar7._0_13_;
          auVar50[0xd] = puVar6[6];
          auVar49._13_3_ = auVar50._13_3_;
          auVar49._0_12_ = auVar7._0_12_;
          auVar49[0xc] = auVar7[6];
          auVar48._12_4_ = auVar49._12_4_;
          auVar48._0_11_ = auVar7._0_11_;
          auVar48[0xb] = puVar6[5];
          auVar47._11_5_ = auVar48._11_5_;
          auVar47._0_10_ = auVar7._0_10_;
          auVar47[10] = auVar7[5];
          auVar46._10_6_ = auVar47._10_6_;
          auVar46._0_9_ = auVar7._0_9_;
          auVar46[9] = puVar6[4];
          auVar45._9_7_ = auVar46._9_7_;
          auVar45._0_8_ = auVar7._0_8_;
          auVar45[8] = auVar7[4];
          auVar44._8_8_ = auVar45._8_8_;
          auVar44[7] = puVar6[3];
          auVar44[6] = auVar7[3];
          auVar44[5] = puVar6[2];
          auVar44[4] = auVar7[2];
          auVar44[3] = puVar6[1];
          auVar44[2] = auVar7[1];
          auVar44[0] = auVar7[0];
          auVar44[1] = *puVar6;
          auVar52 = pmaddubsw(auVar44,auVar25);
          sVar34 = pavgw(auVar52._0_2_ >> 6,0);
          sVar53 = pavgw(auVar52._2_2_ >> 6,0);
          sVar54 = pavgw(auVar52._4_2_ >> 6,0);
          sVar55 = pavgw(auVar52._6_2_ >> 6,0);
          sVar56 = pavgw(auVar52._8_2_ >> 6,0);
          sVar57 = pavgw(auVar52._10_2_ >> 6,0);
          sVar58 = pavgw(auVar52._12_2_ >> 6,0);
          sVar59 = pavgw(auVar52._14_2_ >> 6,0);
          auVar26[1] = puVar6[8];
          auVar26[0] = auVar7[8];
          auVar26[2] = auVar7[9];
          auVar26[3] = puVar6[9];
          auVar26[4] = auVar7[10];
          auVar26[5] = puVar6[10];
          auVar26[6] = auVar7[0xb];
          auVar26[7] = puVar6[0xb];
          auVar26[8] = auVar7[0xc];
          auVar26[9] = puVar6[0xc];
          auVar26[10] = auVar7[0xd];
          auVar26[0xb] = puVar6[0xd];
          auVar26[0xc] = auVar7[0xe];
          auVar26[0xd] = puVar6[0xe];
          auVar26[0xe] = auVar7[0xf];
          auVar26[0xf] = puVar6[0xf];
          auVar7 = pmaddubsw(auVar26,auVar25);
          sVar24 = pavgw(auVar7._0_2_ >> 6,0);
          sVar27 = pavgw(auVar7._2_2_ >> 6,0);
          sVar28 = pavgw(auVar7._4_2_ >> 6,0);
          sVar29 = pavgw(auVar7._6_2_ >> 6,0);
          sVar30 = pavgw(auVar7._8_2_ >> 6,0);
          sVar31 = pavgw(auVar7._10_2_ >> 6,0);
          sVar32 = pavgw(auVar7._12_2_ >> 6,0);
          sVar33 = pavgw(auVar7._14_2_ >> 6,0);
          puVar6 = dst + lVar3;
          *puVar6 = (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34);
          puVar6[1] = (0 < sVar53) * (sVar53 < 0x100) * (char)sVar53 - (0xff < sVar53);
          puVar6[2] = (0 < sVar54) * (sVar54 < 0x100) * (char)sVar54 - (0xff < sVar54);
          puVar6[3] = (0 < sVar55) * (sVar55 < 0x100) * (char)sVar55 - (0xff < sVar55);
          puVar6[4] = (0 < sVar56) * (sVar56 < 0x100) * (char)sVar56 - (0xff < sVar56);
          puVar6[5] = (0 < sVar57) * (sVar57 < 0x100) * (char)sVar57 - (0xff < sVar57);
          puVar6[6] = (0 < sVar58) * (sVar58 < 0x100) * (char)sVar58 - (0xff < sVar58);
          puVar6[7] = (0 < sVar59) * (sVar59 < 0x100) * (char)sVar59 - (0xff < sVar59);
          puVar6[8] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
          puVar6[9] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
          puVar6[10] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
          puVar6[0xb] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
          puVar6[0xc] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
          puVar6[0xd] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
          puVar6[0xe] = (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
          puVar6[0xf] = (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
        }
        dst = dst + (uint)w;
      }
    }
  }
  return;
}

Assistant:

static void bilinear_filter(const uint8_t *src, int src_stride, int xoffset,
                            int yoffset, uint8_t *dst, int w, int h) {
  int i, j;
  // Horizontal filter
  if (xoffset == 0) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        _mm_storeu_si128((__m128i *)&b[j], x);
      }
      src += src_stride;
      b += w;
    }
  } else if (xoffset == 4) {
    uint8_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&src[j + 16]);
        __m128i z = _mm_alignr_epi8(y, x, 1);
        _mm_storeu_si128((__m128i *)&b[j], _mm_avg_epu8(x, z));
      }
      src += src_stride;
      b += w;
    }
  } else {
    uint8_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi16(hfilter[0] | (hfilter[1] << 8));
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&src[j + 16]);
        const __m128i z = _mm_alignr_epi8(y, x, 1);
        const __m128i res = filter_block(x, z, hfilter_vec);
        _mm_storeu_si128((__m128i *)&b[j], res);
      }

      src += src_stride;
      b += w;
    }
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        _mm_storeu_si128((__m128i *)&dst[j], _mm_avg_epu8(x, y));
      }
      dst += w;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi16(vfilter[0] | (vfilter[1] << 8));
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        const __m128i res = filter_block(x, y, vfilter_vec);
        _mm_storeu_si128((__m128i *)&dst[j], res);
      }

      dst += w;
    }
  }
}